

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O1

blargg_err_t __thiscall Snes_Spc::load_spc(Snes_Spc *this,void *data,long size)

{
  uint uVar1;
  undefined1 auVar2 [13];
  undefined7 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [13];
  uint8_t (*pauVar7) [16];
  char *pcVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar15 [16];
  undefined1 uVar11;
  ushort uVar12;
  undefined1 uVar13;
  undefined7 uVar14;
  
  pcVar8 = "Not an SPC file";
  if ((0x22 < size) &&
     (auVar15[0] = -(*(char *)((long)data + 0xb) == ' '),
     auVar15[1] = -(*(char *)((long)data + 0xc) == 'S'),
     auVar15[2] = -(*(char *)((long)data + 0xd) == 'o'),
     auVar15[3] = -(*(char *)((long)data + 0xe) == 'u'),
     auVar15[4] = -(*(char *)((long)data + 0xf) == 'n'),
     auVar15[5] = -(*(char *)((long)data + 0x10) == 'd'),
     auVar15[6] = -(*(char *)((long)data + 0x11) == ' '),
     auVar15[7] = -(*(char *)((long)data + 0x12) == 'F'),
     auVar15[8] = -(*(char *)((long)data + 0x13) == 'i'),
     auVar15[9] = -(*(char *)((long)data + 0x14) == 'l'),
     auVar15[10] = -(*(char *)((long)data + 0x15) == 'e'),
     auVar15[0xb] = -(*(char *)((long)data + 0x16) == ' '),
     auVar15[0xc] = -(*(char *)((long)data + 0x17) == 'D'),
     auVar15[0xd] = -(*(char *)((long)data + 0x18) == 'a'),
     auVar15[0xe] = -(*(char *)((long)data + 0x19) == 't'),
     auVar15[0xf] = -(*(char *)((long)data + 0x1a) == 'a'), auVar9[0] = -(*data == 'S'),
     auVar9[1] = -(*(char *)((long)data + 1) == 'N'),
     auVar9[2] = -(*(char *)((long)data + 2) == 'E'),
     auVar9[3] = -(*(char *)((long)data + 3) == 'S'),
     auVar9[4] = -(*(char *)((long)data + 4) == '-'),
     auVar9[5] = -(*(char *)((long)data + 5) == 'S'),
     auVar9[6] = -(*(char *)((long)data + 6) == 'P'),
     auVar9[7] = -(*(char *)((long)data + 7) == 'C'),
     auVar9[8] = -(*(char *)((long)data + 8) == '7'),
     auVar9[9] = -(*(char *)((long)data + 9) == '0'),
     auVar9[10] = -(*(char *)((long)data + 10) == '0'),
     auVar9[0xb] = -(*(char *)((long)data + 0xb) == ' '),
     auVar9[0xc] = -(*(char *)((long)data + 0xc) == 'S'),
     auVar9[0xd] = -(*(char *)((long)data + 0xd) == 'o'),
     auVar9[0xe] = -(*(char *)((long)data + 0xe) == 'u'),
     auVar9[0xf] = -(*(char *)((long)data + 0xf) == 'n'), auVar9 = auVar9 & auVar15,
     (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff)) {
    if (size < 0x10180) {
      pcVar8 = "Corrupt SPC file";
    }
    else {
      (this->m).cpu_regs.pc = (uint)*(ushort *)((long)data + 0x25);
      uVar1 = *(uint *)((long)data + 0x27);
      auVar2[0xc] = (char)(uVar1 >> 0x18);
      auVar2._0_12_ = ZEXT712(0);
      auVar6[1] = 0;
      auVar6[0] = (byte)(uVar1 >> 0x10);
      auVar6._2_3_ = auVar2._10_3_;
      auVar6._5_8_ = 0;
      uVar13 = 0;
      uVar11 = (byte)(uVar1 >> 8);
      uVar12 = CONCAT11(uVar13,uVar11);
      uVar3 = SUB137(auVar6 << 0x40,6);
      uVar14 = uVar3;
      auVar10._4_9_ = CONCAT72(uVar14,uVar12);
      auVar10._0_4_ = uVar1 & 0xff;
      auVar10._13_3_ = 0;
      (this->m).cpu_regs.a = auVar10._0_4_;
      (this->m).cpu_regs.x = (int)auVar10._4_9_;
      (this->m).cpu_regs.y = (int)((uint7)uVar3 >> 0x10);
      (this->m).cpu_regs.psw = auVar10._12_4_;
      (this->m).cpu_regs.sp = (uint)*(byte *)((long)data + 0x2b);
      memcpy((this->m).ram.ram,(void *)((long)data + 0x100),0x10000);
      (this->m).rom_enabled = 0;
      uVar4 = *(undefined8 *)((this->m).ram.ram + 0xf0);
      uVar5 = *(undefined8 *)((this->m).ram.ram + 0xf8);
      *(undefined8 *)(this->m).smp_regs[0] = uVar4;
      *(undefined8 *)((this->m).smp_regs[0] + 8) = uVar5;
      *(undefined8 *)(this->m).smp_regs[1] = uVar4;
      *(undefined8 *)((this->m).smp_regs[1] + 8) = uVar5;
      pcVar8 = (blargg_err_t)0x0;
      *(uint8_t *)((long)((this->m).smp_regs + 1) + 0) = '\0';
      *(uint8_t *)((long)((this->m).smp_regs + 1) + 1) = '\0';
      pauVar7 = (this->m).smp_regs;
      *(uint8_t *)((long)(pauVar7 + 1) + 10) = '\0';
      *(uint8_t *)((long)(pauVar7 + 1) + 0xb) = '\0';
      (this->m).smp_regs[1][0xc] = '\0';
      memset(&(this->m).ram,0xff,0x100);
      memset((this->m).ram.padding2,0xff,0x100);
      Spc_Dsp::load(&this->dsp,(uint8_t *)((long)data + 0x10100));
      reset_time_regs(this);
    }
  }
  return pcVar8;
}

Assistant:

blargg_err_t Snes_Spc::load_spc( void const* data, long size )
{
	spc_file_t const* const spc = (spc_file_t const*) data;
	
	// be sure compiler didn't insert any padding into fle_t
	assert( sizeof (spc_file_t) == spc_min_file_size + 0x80 );
	
	// Check signature and file size
	if ( size < signature_size || memcmp( spc, signature, 27 ) )
		return "Not an SPC file";
	
	if ( size < spc_min_file_size )
		return "Corrupt SPC file";
	
	// CPU registers
	m.cpu_regs.pc  = spc->pch * 0x100 + spc->pcl;
	m.cpu_regs.a   = spc->a;
	m.cpu_regs.x   = spc->x;
	m.cpu_regs.y   = spc->y;
	m.cpu_regs.psw = spc->psw;
	m.cpu_regs.sp  = spc->sp;
	
	// RAM and registers
	memcpy( RAM, spc->ram, 0x10000 );
	ram_loaded();
	
	// DSP registers
	dsp.load( spc->dsp );
	
	reset_time_regs();
	
	return 0;
}